

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O3

void av1_update_mv_stats(MV *mv,MV *ref,nmv_context *mvctx,MvSubpelPrecision precision)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  ushort uVar5;
  ushort uVar6;
  short sVar7;
  byte bVar8;
  ulong uVar9;
  
  sVar1 = mv->row;
  sVar2 = mv->col;
  sVar3 = ref->row;
  sVar4 = ref->col;
  uVar5 = mvctx->joints_cdf[4];
  bVar8 = (char)(uVar5 >> 4) + 5;
  uVar9 = 0;
  do {
    uVar6 = mvctx->joints_cdf[uVar9];
    if (uVar9 < (ulong)(sVar2 != sVar4) + (ulong)(sVar1 != sVar3) * 2) {
      sVar7 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar8 & 0x1f));
    }
    else {
      sVar7 = -(uVar6 >> (bVar8 & 0x1f));
    }
    mvctx->joints_cdf[uVar9] = sVar7 + uVar6;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 3);
  mvctx->joints_cdf[4] = mvctx->joints_cdf[4] + (ushort)(uVar5 < 0x20);
  if (sVar1 != sVar3) {
    update_mv_component_stats((int)(short)(sVar1 - sVar3),mvctx->comps,precision);
  }
  if (sVar2 != sVar4) {
    update_mv_component_stats((int)(short)(sVar2 - sVar4),mvctx->comps + 1,precision);
    return;
  }
  return;
}

Assistant:

void av1_update_mv_stats(const MV *mv, const MV *ref, nmv_context *mvctx,
                         MvSubpelPrecision precision) {
  const MV diff = { mv->row - ref->row, mv->col - ref->col };
  const MV_JOINT_TYPE j = av1_get_mv_joint(&diff);

  update_cdf(mvctx->joints_cdf, j, MV_JOINTS);

  if (mv_joint_vertical(j))
    update_mv_component_stats(diff.row, &mvctx->comps[0], precision);

  if (mv_joint_horizontal(j))
    update_mv_component_stats(diff.col, &mvctx->comps[1], precision);
}